

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

void __thiscall QGridLayoutPrivate::deleteAll(QGridLayoutPrivate *this)

{
  QArrayDataPointer<QLayoutStruct> *this_00;
  value_type pQVar1;
  
  while ((this->things).d.size != 0) {
    pQVar1 = QList<QGridBox_*>::takeFirst(&this->things);
    if ((pQVar1 != (value_type)0x0) && (pQVar1->item_ != (QLayoutItem *)0x0)) {
      (*pQVar1->item_->_vptr_QLayoutItem[1])();
    }
    operator_delete(pQVar1,0x18);
  }
  this_00 = &this->hfwData->d;
  if (this_00 != (QArrayDataPointer<QLayoutStruct> *)0x0) {
    QArrayDataPointer<QLayoutStruct>::~QArrayDataPointer(this_00);
  }
  operator_delete(this_00,0x18);
  return;
}

Assistant:

void QGridLayoutPrivate::deleteAll()
{
    while (!things.isEmpty())
        delete things.takeFirst();
    delete hfwData;
}